

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReturnStatement.h
# Opt level: O2

void __thiscall ReturnStatement::execute(ReturnStatement *this,Environment *env)

{
  element_type *peVar1;
  ReturnPacket *this_00;
  ptr<Value> toReturn;
  __shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    toReturn.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    toReturn.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (**peVar1->_vptr_Expression)(&toReturn,peVar1,env);
  }
  this_00 = (ReturnPacket *)__cxa_allocate_exception(0x10);
  std::__shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&toReturn.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>);
  ReturnPacket::ReturnPacket(this_00,(ptr<Value> *)&local_20);
  __cxa_throw(this_00,&ReturnPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

void execute(Environment *env) override {
        ptr<Value> toReturn = expression ? expression->evaluate(env) : nullptr;
        throw ReturnPacket(toReturn);
    }